

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JP2K.cpp
# Opt level: O2

MXFReader * __thiscall AS_02::JP2K::MXFReader::FillWriterInfo(MXFReader *this,WriterInfo *Info)

{
  char cVar1;
  WriterInfo *in_RDX;
  undefined1 *puVar2;
  
  puVar2 = Kumu::RESULT_INIT;
  if (*(long *)(Info->ProductUUID + 8) != 0) {
    cVar1 = (**(code **)(**(long **)(*(long *)(Info->ProductUUID + 8) + 0x10) + 0x40))();
    if (cVar1 != '\0') {
      ASDCP::WriterInfo::operator=(in_RDX,(WriterInfo *)(*(long *)(Info->ProductUUID + 8) + 0x420));
      puVar2 = Kumu::RESULT_OK;
    }
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar2);
  return this;
}

Assistant:

Result_t
AS_02::JP2K::MXFReader::FillWriterInfo(WriterInfo& Info) const
{
  if ( m_Reader && m_Reader->m_File->IsOpen() )
    {
      Info = m_Reader->m_Info;
      return RESULT_OK;
    }

  return RESULT_INIT;
}